

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  Lookaside *pLVar1;
  u8 uVar2;
  ushort uVar3;
  sqlite3 *db;
  Table *pTVar4;
  char *__s;
  undefined1 uVar5;
  u16 uVar6;
  int iVar7;
  uint uVar8;
  HashElem *pHVar9;
  sColMap *psVar10;
  size_t sVar11;
  Expr *pEVar12;
  Expr *pEVar13;
  Expr *pRight;
  ExprList *pEVar14;
  SrcList *pSrc;
  Select *pDup;
  Trigger *p;
  Schema *pSVar15;
  Select *pSVar16;
  i16 *piVar17;
  FKey *p_00;
  long lVar18;
  Schema **ppSVar19;
  sqlite3 *db_00;
  long lVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  Expr *local_f0;
  Expr *local_e0;
  ExprList *local_d0;
  TriggerStep *local_c0;
  int *aiCol;
  int local_9c;
  Token tFromCol;
  Token tNew;
  Token tOld;
  Index *pIdx;
  int *local_58;
  i16 *local_50;
  sColMap *local_48;
  Token tToCol;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    pHVar9 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    p_00 = (FKey *)pHVar9->data;
    if (p_00 != (FKey *)0x0) {
      bVar23 = pChanges != (ExprList *)0x0;
      local_50 = &pTab->iPKey;
      local_9c = bChngRowid;
      local_58 = aChange;
      do {
        if ((aChange == (int *)0x0) ||
           (iVar7 = fkParentIsModified(pTab,p_00,aChange,bChngRowid), iVar7 != 0)) {
          db = pParse->db;
          uVar2 = p_00->aAction[bVar23];
          if ((uVar2 != '\a') || ((db->flags & 0x80000) == 0)) {
            p = p_00->apTrigger[bVar23];
            if ((uVar2 == '\0') || (p != (Trigger *)0x0)) {
              if (p != (Trigger *)0x0) {
LAB_001ae109:
                sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
              }
            }
            else {
              pIdx = (Index *)0x0;
              aiCol = (int *)0x0;
              iVar7 = sqlite3FkLocateIndex(pParse,pTab,p_00,&pIdx,&aiCol);
              if (iVar7 == 0) {
                if (p_00->nCol < 1) {
                  local_f0 = (Expr *)0x0;
                  local_d0 = (ExprList *)0x0;
                  local_e0 = (Expr *)0x0;
                }
                else {
                  local_48 = p_00->aCol;
                  lVar20 = 0;
                  lVar18 = 0;
                  lVar22 = 0;
                  local_e0 = (Expr *)0x0;
                  local_d0 = (ExprList *)0x0;
                  local_f0 = (Expr *)0x0;
                  do {
                    tOld.z = "old";
                    tOld.n = 3;
                    tOld._12_4_ = 0;
                    psVar10 = (sColMap *)((long)aiCol + lVar20);
                    if (aiCol == (int *)0x0) {
                      psVar10 = local_48;
                    }
                    tNew.z = "new";
                    tNew.n = 3;
                    tNew._12_4_ = 0;
                    piVar17 = local_50;
                    if (pIdx != (Index *)0x0) {
                      piVar17 = (i16 *)((long)pIdx->aiColumn + lVar18);
                    }
                    iVar7 = psVar10->iFrom;
                    tToCol.z = pTab->aCol[*piVar17].zCnName;
                    uVar21 = 0;
                    uVar8 = 0;
                    if (tToCol.z != (char *)0x0) {
                      sVar11 = strlen(tToCol.z);
                      uVar8 = (uint)sVar11 & 0x3fffffff;
                    }
                    tFromCol.z = p_00->pFrom->aCol[iVar7].zCnName;
                    tToCol.n = uVar8;
                    if (tFromCol.z != (char *)0x0) {
                      sVar11 = strlen(tFromCol.z);
                      uVar21 = (uint)sVar11 & 0x3fffffff;
                    }
                    tFromCol.n = uVar21;
                    pEVar12 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                    pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                    pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                    pEVar13 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                    pEVar12 = sqlite3PExpr(pParse,0x35,pEVar12,pEVar13);
                    local_f0 = sqlite3ExprAnd(pParse,local_f0,pEVar12);
                    if (pChanges != (ExprList *)0x0) {
                      pEVar12 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                      pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                      pEVar13 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                      pRight = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar13 = sqlite3PExpr(pParse,0x8d,pEVar13,pRight);
                      pEVar12 = sqlite3PExpr(pParse,0x2d,pEVar12,pEVar13);
                      local_e0 = sqlite3ExprAnd(pParse,local_e0,pEVar12);
                    }
                    if ((uVar2 != '\n' || pChanges != (ExprList *)0x0) && uVar2 != '\a') {
                      if (uVar2 == '\t') {
                        pTVar4 = p_00->pFrom;
                        if ((((((pTVar4->aCol[iVar7].colFlags & 0x60) == 0) &&
                              (uVar3 = pTVar4->aCol[iVar7].iDflt, uVar3 != 0)) &&
                             (pTVar4->eTabType == '\0')) &&
                            ((pEVar14 = (pTVar4->u).tab.pDfltList, pEVar14 != (ExprList *)0x0 &&
                             ((int)(uint)uVar3 <= pEVar14->nExpr)))) &&
                           (pEVar12 = pEVar14->a[uVar3 - 1].pExpr, pEVar12 != (Expr *)0x0)) {
                          pEVar12 = exprDup(db,pEVar12,0,(u8 **)0x0);
                        }
                        else {
                          pEVar12 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                          if (pEVar12 == (Expr *)0x0) {
                            pEVar12 = (Expr *)0x0;
                          }
                          else {
                            pEVar12->op = '\0';
                            pEVar12->affExpr = '\0';
                            pEVar12->op2 = '\0';
                            pEVar12->field_0x3 = 0;
                            pEVar12->flags = 0;
                            (pEVar12->u).zToken = (char *)0x0;
                            pEVar12->iColumn = 0;
                            pEVar12->iAgg = 0;
                            pEVar12->w = (anon_union_4_2_009eaf8f_for_w)0x0;
                            pEVar12->pAggInfo = (AggInfo *)0x0;
                            (pEVar12->x).pList = (ExprList *)0x0;
                            pEVar12->nHeight = 0;
                            pEVar12->iTable = 0;
                            pEVar12->pLeft = (Expr *)0x0;
                            pEVar12->pRight = (Expr *)0x0;
                            (pEVar12->y).pTab = (Table *)0x0;
                            pEVar12->op = 'y';
                            pEVar12->iAgg = -1;
                            pEVar12->nHeight = 1;
                          }
                        }
                      }
                      else if (uVar2 == '\n') {
                        pEVar12 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                        pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                        pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                      }
                      else {
                        pEVar12 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                        if (pEVar12 == (Expr *)0x0) {
                          pEVar12 = (Expr *)0x0;
                        }
                        else {
                          pEVar12->op = '\0';
                          pEVar12->affExpr = '\0';
                          pEVar12->op2 = '\0';
                          pEVar12->field_0x3 = 0;
                          pEVar12->flags = 0;
                          (pEVar12->u).zToken = (char *)0x0;
                          pEVar12->iColumn = 0;
                          pEVar12->iAgg = 0;
                          pEVar12->w = (anon_union_4_2_009eaf8f_for_w)0x0;
                          pEVar12->pAggInfo = (AggInfo *)0x0;
                          (pEVar12->x).pList = (ExprList *)0x0;
                          pEVar12->nHeight = 0;
                          pEVar12->iTable = 0;
                          pEVar12->pLeft = (Expr *)0x0;
                          pEVar12->pRight = (Expr *)0x0;
                          (pEVar12->y).pTab = (Table *)0x0;
                          pEVar12->op = 'y';
                          pEVar12->iAgg = -1;
                          pEVar12->nHeight = 1;
                        }
                      }
                      local_d0 = sqlite3ExprListAppend(pParse,local_d0,pEVar12);
                      sqlite3ExprListSetName(pParse,local_d0,&tFromCol,0);
                    }
                    lVar22 = lVar22 + 1;
                    lVar18 = lVar18 + 2;
                    lVar20 = lVar20 + 4;
                  } while (lVar22 < p_00->nCol);
                }
                if (aiCol != (int *)0x0) {
                  sqlite3DbFreeNN(db,aiCol);
                }
                aChange = local_58;
                bChngRowid = local_9c;
                __s = p_00->pFrom->zName;
                if (__s == (char *)0x0) {
                  uVar8 = 0;
                }
                else {
                  sVar11 = strlen(__s);
                  uVar8 = (uint)sVar11 & 0x3fffffff;
                }
                if (uVar2 == '\a') {
                  if (pTab->pSchema == (Schema *)0x0) {
                    lVar18 = -0x8000;
                  }
                  else {
                    lVar18 = -0x100000000;
                    ppSVar19 = &db->aDb->pSchema;
                    do {
                      lVar18 = lVar18 + 0x100000000;
                      pSVar15 = *ppSVar19;
                      ppSVar19 = ppSVar19 + 4;
                    } while (pSVar15 != pTab->pSchema);
                    lVar18 = lVar18 >> 0x20;
                  }
                  tNew.n = uVar8;
                  tFromCol.z = db->aDb[lVar18].zDbSName;
                  tNew.z = __s;
                  if (tFromCol.z == (char *)0x0) {
                    tFromCol.n = 0;
                  }
                  else {
                    sVar11 = strlen(tFromCol.z);
                    tFromCol.n = (uint)sVar11 & 0x3fffffff;
                  }
                  tOld.z = "FOREIGN KEY constraint failed";
                  tOld.n = 0x1d;
                  pEVar12 = sqlite3ExprAlloc(db,0x47,&tOld,0);
                  if (pEVar12 == (Expr *)0x0) {
                    db_00 = pParse->db;
                    pEVar12 = (Expr *)0x0;
                  }
                  else {
                    pEVar12->affExpr = '\x02';
                    db_00 = pParse->db;
                  }
                  pEVar14 = sqlite3ExprListAppendNew(db_00,pEVar12);
                  pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,&tFromCol,&tNew);
                  pDup = sqlite3SelectNew(pParse,pEVar14,pSrc,local_f0,(ExprList *)0x0,(Expr *)0x0,
                                          (ExprList *)0x0,0,(Expr *)0x0);
                  local_f0 = (Expr *)0x0;
                }
                else {
                  pDup = (Select *)0x0;
                }
                (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
                (db->lookaside).sz = 0;
                p = (Trigger *)sqlite3DbMallocZero(db,(ulong)uVar8 + 0xa9);
                if (p == (Trigger *)0x0) {
                  local_c0 = (TriggerStep *)0x0;
                }
                else {
                  local_c0 = (TriggerStep *)(p + 1);
                  p->step_list = local_c0;
                  p[1].pWhen = (Expr *)&p[2].pWhen;
                  memcpy(&p[2].pWhen,__s,(ulong)uVar8);
                  if (local_f0 == (Expr *)0x0) {
                    pSVar15 = (Schema *)0x0;
                  }
                  else {
                    pSVar15 = (Schema *)exprDup(db,local_f0,1,(u8 **)0x0);
                  }
                  p[1].pSchema = pSVar15;
                  pSVar15 = (Schema *)sqlite3ExprListDup(db,local_d0,1);
                  p[1].pTabSchema = pSVar15;
                  pSVar16 = sqlite3SelectDup(db,pDup,1);
                  *(Select **)&p[1].op = pSVar16;
                  if (local_e0 == (Expr *)0x0) {
                    local_e0 = (Expr *)0x0;
                  }
                  else {
                    local_e0 = sqlite3PExpr(pParse,0x13,local_e0,(Expr *)0x0);
                    pEVar12 = (Expr *)0x0;
                    if (local_e0 != (Expr *)0x0) {
                      pEVar12 = exprDup(db,local_e0,1,(u8 **)0x0);
                    }
                    p->pWhen = pEVar12;
                  }
                }
                pLVar1 = &db->lookaside;
                pLVar1->bDisable = pLVar1->bDisable - 1;
                if (pLVar1->bDisable == 0) {
                  uVar6 = (db->lookaside).szTrue;
                }
                else {
                  uVar6 = 0;
                }
                (db->lookaside).sz = uVar6;
                if (local_f0 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_f0);
                }
                if (local_e0 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_e0);
                }
                if (local_d0 != (ExprList *)0x0) {
                  exprListDeleteNN(db,local_d0);
                }
                if (pDup != (Select *)0x0) {
                  clearSelect(db,pDup,1);
                }
                if (db->mallocFailed != '\x01') {
                  if (uVar2 == '\a') {
                    uVar5 = 0x8a;
                  }
                  else if ((uVar2 == '\n') && (pChanges == (ExprList *)0x0)) {
                    uVar5 = 0x80;
                  }
                  else {
                    uVar5 = 0x81;
                  }
                  local_c0->op = uVar5;
                  local_c0->pTrig = p;
                  pSVar15 = pTab->pSchema;
                  p->pSchema = pSVar15;
                  p->pTabSchema = pSVar15;
                  p_00->apTrigger[bVar23] = p;
                  p->op = bVar23 | 0x80;
                  goto LAB_001ae109;
                }
                fkTriggerDelete(db,p);
              }
            }
          }
        }
        p_00 = p_00->pNextTo;
      } while (p_00 != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that
  ** refer to table pTab. If there is an action associated with the FK
  ** for this operation (either update or delete), invoke the associated
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}